

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

void __thiscall Widget::writeXmlChildren(Widget *this,stringstream *str,int indent)

{
  int iVar1;
  ostream *poVar2;
  pointer ppWVar3;
  undefined4 in_register_00000014;
  ostream *poVar4;
  ulong uVar5;
  char *local_58;
  long local_50;
  char local_48 [16];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,indent);
  poVar4 = (ostream *)(str + 0x10);
  Util::getIndent_abi_cxx11_(0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<Widgets>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  ppWVar3 = (this->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppWVar3) {
    iVar1 = (int)local_38;
    uVar5 = 0;
    do {
      (**ppWVar3[uVar5]->_vptr_Widget)(&local_58,ppWVar3[uVar5],(ulong)(iVar1 + 1));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      uVar5 = uVar5 + 1;
      ppWVar3 = (this->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->children).
                                   super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppWVar3 >> 3));
  }
  Util::getIndent_abi_cxx11_(0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</Widgets>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void Widget::writeXmlChildren(std::stringstream& str, int indent) const
{
	str << Util::getIndent(indent) << "<Widgets>" << std::endl;
	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}
	str << Util::getIndent(indent) << "</Widgets>" << std::endl;
}